

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *other)

{
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *other_local;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (DataLocation *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
               0x0;
  other->endPtr = (DataLocation *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }